

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Const * kratos::Const::constant
                  (string *hex_value,uint32_t num_bits,bool negative,uint32_t width,bool is_signed)

{
  Const *pCVar1;
  long lVar2;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint32_t local_44;
  Const *pCStack_40;
  uint32_t width_local;
  shared_ptr<kratos::Const> p;
  bool is_signed_local;
  
  local_68._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  pCStack_40 = (Const *)0x0;
  local_44 = width;
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::Const,std::allocator<kratos::Const>,unsigned_long,unsigned_int&,bool&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,&stack0xffffffffffffffc0,
             (allocator<kratos::Const> *)
             ((long)&p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 6),(unsigned_long *)&local_68,&local_44,
             (bool *)((long)&p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
  std::__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::Const,kratos::Const>
            ((__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
             pCStack_40);
  lVar2 = std::__cxx11::string::find_first_not_of((char *)hex_value,0x24e26f,0);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)&pCStack_40->hex_value_);
    pCStack_40->negative_ = negative;
    pCStack_40->num_bits_ = num_bits;
    std::
    _Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<std::shared_ptr<kratos::Const>&>
              ((_Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&consts_);
    pCVar1 = pCStack_40;
    if (p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return pCVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Invalid hex value for constant ",hex_value);
  std::invalid_argument::invalid_argument(this,(string *)&local_68);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Const &Const::constant(const std::string &hex_value, uint32_t num_bits, bool negative,
                       uint32_t width, bool is_signed) {
    auto p = std::make_shared<Const>(std::numeric_limits<uint64_t>::max(), width, is_signed);
    if (hex_value.find_first_not_of("abcdefABCDEF0123456789") != std::string::npos) {
        throw std::invalid_argument("Invalid hex value for constant " + hex_value);
    }
    p->hex_value_ = hex_value;
    p->negative_ = negative;
    p->num_bits_ = num_bits;
    consts_.emplace(p);
    return *p;
}